

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpio.c
# Opt level: O3

int gpioSerialReadClose(uint gpio)

{
  int iVar1;
  
  if ((3 < gpioCfg.dbgLevel) && ((gpioCfg.internals >> 10 & 1) == 0)) {
    gpioSerialReadClose_cold_1();
  }
  if (libInitialised == '\0') {
    iVar1 = -0x1f;
    if ((gpioCfg.internals >> 10 & 1) == 0) {
      gpioSerialReadClose_cold_2();
    }
  }
  else if (gpio < 0x20) {
    if (wfRx[gpio].mode == 1) {
      free(wfRx[gpio].field_4.s.buf);
      iVar1 = 0;
      gpioSetWatchdog(gpio,0);
      gpioSetAlertFunc(gpio,(gpioAlertFunc_t)0x0);
      wfRx[gpio].mode = 0;
    }
    else {
      iVar1 = 0;
      if ((wfRx[gpio].mode == 0) && (iVar1 = -0x26, (gpioCfg.internals >> 10 & 1) == 0)) {
        gpioSerialReadClose_cold_3();
      }
    }
  }
  else {
    iVar1 = -2;
    if ((gpioCfg.internals >> 10 & 1) == 0) {
      gpioSerialReadClose_cold_4();
    }
  }
  return iVar1;
}

Assistant:

int gpioSerialReadClose(unsigned gpio)
{
   DBG(DBG_USER, "gpio=%d", gpio);

   CHECK_INITED;

   if (gpio > PI_MAX_USER_GPIO)
      SOFT_ERROR(PI_BAD_USER_GPIO, "bad gpio (%d)", gpio);

   switch(wfRx[gpio].mode)
   {
      case PI_WFRX_NONE:

         SOFT_ERROR(PI_NOT_SERIAL_GPIO, "no serial read on gpio (%d)", gpio);

         break;

      case PI_WFRX_SERIAL:

         free(wfRx[gpio].s.buf);

         gpioSetWatchdog(gpio, 0); /* switch off timeouts */

         gpioSetAlertFunc(gpio, NULL); /* cancel alert */

         wfRx[gpio].mode = PI_WFRX_NONE;

         break;
   }

   return 0;
}